

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Callback.hpp
# Opt level: O1

void __thiscall
Callback::Emitter::emit<MyEmitter,String,int>
          (Emitter *this,offset_in_MyEmitter_to_subr signal,String *arg0,int arg1)

{
  usize *puVar1;
  undefined4 in_register_0000000c;
  Iterator IVar2;
  undefined4 in_R8D;
  long *plVar3;
  code *pcVar4;
  SignalActivation activation;
  String local_a0;
  SignalActivation local_78;
  Memory local_50 [16];
  offset_in_MyEmitter_to_subr local_40;
  String *local_38;
  
  local_40 = signal;
  local_38 = arg0;
  Memory::copy(local_50,(EVP_PKEY_CTX *)&local_40,(EVP_PKEY_CTX *)0x10);
  SignalActivation::SignalActivation(&local_78,this,(MemberFuncPtr *)local_50);
  if (local_78.end.item != local_78.begin.item) {
    IVar2.item = local_78.begin.item;
    do {
      if (((IVar2.item)->value).state == connected) {
        pcVar4 = (code *)((IVar2.item)->value).slot.ptr;
        plVar3 = (long *)((long)((IVar2.item)->value).object +
                         *(long *)&((IVar2.item)->value).slot.field_0x8);
        if (((ulong)pcVar4 & 1) != 0) {
          pcVar4 = *(code **)(pcVar4 + *plVar3 + -1);
        }
        String::String(&local_a0,(String *)CONCAT44(in_register_0000000c,arg1));
        (*pcVar4)(plVar3,&local_a0,in_R8D);
        if ((local_a0.data)->ref != 0) {
          LOCK();
          puVar1 = &(local_a0.data)->ref;
          *puVar1 = *puVar1 - 1;
          UNLOCK();
          if ((*puVar1 == 0) && (local_a0.data != (Data *)0x0)) {
            operator_delete__(local_a0.data);
          }
        }
      }
    } while ((local_78.invalidated == false) &&
            (IVar2.item = (IVar2.item)->next, IVar2.item != local_78.end.item));
  }
  SignalActivation::~SignalActivation(&local_78);
  return;
}

Assistant:

void emit(void (X::*signal)(A, B), A arg0, B arg1){SignalActivation activation(this, signal); for(List<Slot>::Iterator i = activation.begin; i != activation.end; ++i) {if(i->state == Slot::connected) 
      (((X*)i->object)->*((MemberFuncPtr2<X, A, B>*)&i->slot)->ptr)(arg0, arg1); if(activation.invalidated) return;}}